

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

wchar_t div_u16n(uint16_t *q,uint16_t *r,uint16_t *w,uint16_t *num,uint16_t *den,size_t nq,size_t n,
                size_t nd)

{
  uint16_t *puVar1;
  _Bool _Var2;
  wchar_t wVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  uint16_t uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  bool bVar15;
  uint16_t try;
  uint16_t local_92;
  uint16_t *local_90;
  uint16_t *local_88;
  size_t local_80;
  uint16_t *local_78;
  uint16_t *local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_90 = r;
  local_78 = q;
  local_70 = den;
  sVar4 = msb_u16n(den,nd);
  if (sVar4 == 0) {
    wVar3 = L'\x02';
  }
  else {
    uVar5 = msb_u16n(num,n);
    for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
      local_90[sVar6] = num[sVar6];
    }
    local_68 = (uVar5 - sVar4) + 0xf >> 4;
    if (uVar5 <= sVar4) {
      local_68 = 1;
    }
    sVar6 = nq;
    if (nq < local_68) {
      sVar6 = local_68;
    }
    lVar10 = sVar6 << 4;
    lVar13 = sVar4 - 0x10;
    sVar4 = nd + 1;
    local_50 = n + 1;
    local_88 = w;
    local_60 = lVar13;
    local_58 = nq;
    while (uVar11 = sVar6 - 1, sVar6 != 0) {
      if (uVar5 < (ulong)(lVar13 + lVar10)) {
        bVar15 = sVar6 <= nq;
        lVar7 = nq - sVar6;
        sVar6 = uVar11;
        if (bVar15) {
          local_78[lVar7] = 0;
        }
      }
      else {
        uVar5 = (uVar5 + 1) - (lVar13 + lVar10);
        if (uVar5 == 0) {
          __assert_fail("lo < hi - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x541,
                        "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                       );
        }
        if (0xf < uVar5) {
          uVar5 = 0x10;
        }
        uVar14 = 1 << ((byte)uVar5 & 0x1f);
        local_80 = local_50 - sVar6;
        uVar12 = 0;
        local_48 = sVar6;
        local_40 = uVar11;
        local_38 = lVar10;
        do {
          while( true ) {
            puVar1 = local_88;
            uVar9 = uVar14 + (uVar12 & 0xffff) >> 1;
            uVar8 = (uint16_t)uVar9;
            try = uVar8;
            _Var2 = mul_u16n(local_88,local_70,&try,sVar4,nd,1);
            if (_Var2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x548,
                            "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                           );
            }
            wVar3 = cmp_u16n(local_90,puVar1,local_80,sVar4);
            puVar1 = local_88;
            if (wVar3 < L'\0') break;
            if ((wVar3 == L'\0') || (uVar12 = uVar9, uVar14 - 1 == (uVar9 & 0xffff)))
            goto LAB_001ec333;
          }
          uVar14 = uVar9 & 0xffff;
        } while (uVar14 - 1 != (uVar12 & 0xffff));
        local_92 = (uint16_t)uVar12;
        _Var2 = mul_u16n(local_88,local_70,&local_92,sVar4,nd,1);
        if (_Var2) {
          __assert_fail("!over",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x556,
                        "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                       );
        }
        wVar3 = cmp_u16n(local_90,puVar1,local_80,sVar4);
        uVar8 = (uint16_t)uVar12;
        if (wVar3 < L'\0') {
          __assert_fail("cmp_u16n(r, w, n - (iqr - 1), nd + 1) >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x558,
                        "int div_u16n(uint16_t *, uint16_t *, uint16_t *, const uint16_t *, const uint16_t *, size_t, size_t, size_t)"
                       );
        }
LAB_001ec333:
        nq = local_58;
        puVar1 = local_90;
        if (local_48 <= local_58) {
          local_78[local_58 - local_48] = uVar8;
        }
        subip_u16n(local_90,local_88,local_80,sVar4);
        uVar5 = msb_u16n(puVar1,n);
        lVar10 = local_38;
        sVar6 = local_40;
        lVar13 = local_60;
      }
      lVar10 = lVar10 + -0x10;
    }
    wVar3 = (wchar_t)(nq < local_68);
  }
  return wVar3;
}

Assistant:

static int div_u16n(uint16_t *q, uint16_t *r, uint16_t *w, const uint16_t *num,
		const uint16_t *den, size_t nq, size_t n, size_t nd)
{
	size_t msb_d = msb_u16n(den, nd), msb_r;
	size_t nqu, ir, iqr, iqrb;

	if (msb_d == 0) {
		return 2;
	}
	msb_r = msb_u16n(num, n);
	if (msb_r > msb_d) {
		nqu = ((msb_r - msb_d) + 15) / 16;
	} else {
		nqu = 1;
	}

	for (ir = 0; ir < n; ++ir) {
		r[ir] = num[ir];
	}

	for (iqr = MAX(nq, nqu), iqrb = MAX(nq, nqu) * 16; iqr > 0;
			--iqr, iqrb -= 16) {
		uint16_t lo;
		uint32_t hi;
		bool redo_w;

		if (msb_d + iqrb - 16 > msb_r) {
			if (iqr <= nq) {
				q[nq - iqr] = 0;
			}
			continue;
		}
		/* Use binary search to determine the digit in the quotient. */
		lo = 0;
		hi = (uint32_t)1 << MIN(16, (msb_r - msb_d  + 1 - (iqrb - 16)));
		redo_w = true;
		assert (lo < hi - 1);
		while (1) {
			uint16_t try = (uint16_t)((lo + hi) / 2);
			bool over = mul_u16n(w, den, &try, nd + 1, nd, 1);
			int c;

			if (over) {
				assert(0);
			}
			c = cmp_u16n(r, w, n - (iqr - 1), nd + 1);
			if (c < 0) {
				hi = try;
				redo_w = true;
			} else {
				lo = try;
				redo_w = false;
			}
			if (!c || lo == hi - 1) {
				if (redo_w) {
					over = mul_u16n(w, den, &lo, nd + 1,
						nd, 1);
					assert(!over);
					assert(cmp_u16n(r, w, n - (iqr - 1),
						nd + 1) >= 0);
				}
				if (iqr <= nq) {
					q[nq - iqr] = lo;
				}
				subip_u16n(r, w, n - (iqr - 1), nd + 1);
				msb_r = msb_u16n(r, n);
				break;
			}
		}
	}
	return (nqu > nq) ? 1 : 0;
}